

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

IGeneratorTracker * __thiscall
Catch::RunContext::acquireGeneratorTracker
          (RunContext *this,StringRef generatorName,SourceLineInfo *lineInfo)

{
  GeneratorTracker *pGVar1;
  string local_80;
  NameAndLocation local_60;
  GeneratorTracker *tracker;
  SourceLineInfo *lineInfo_local;
  RunContext *this_local;
  StringRef generatorName_local;
  
  generatorName_local.m_start = (char *)generatorName.m_size;
  this_local = (RunContext *)generatorName.m_start;
  tracker = (GeneratorTracker *)lineInfo;
  lineInfo_local = (SourceLineInfo *)this;
  StringRef::operator_cast_to_string(&local_80,(StringRef *)&this_local);
  TestCaseTracking::NameAndLocation::NameAndLocation(&local_60,&local_80,(SourceLineInfo *)tracker);
  pGVar1 = Generators::GeneratorTracker::acquire(&this->m_trackerContext,&local_60);
  TestCaseTracking::NameAndLocation::~NameAndLocation(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  (this->m_lastAssertionInfo).lineInfo.file =
       (char *)(tracker->super_TrackerBase).super_ITracker._vptr_ITracker;
  (this->m_lastAssertionInfo).lineInfo.line =
       *(size_t *)&(tracker->super_TrackerBase).super_ITracker.m_nameAndLocation.name;
  return &pGVar1->super_IGeneratorTracker;
}

Assistant:

auto RunContext::acquireGeneratorTracker( StringRef generatorName, SourceLineInfo const& lineInfo ) -> IGeneratorTracker& {
        using namespace Generators;
        GeneratorTracker& tracker = GeneratorTracker::acquire(m_trackerContext,
                                                              TestCaseTracking::NameAndLocation( static_cast<std::string>(generatorName), lineInfo ) );
        m_lastAssertionInfo.lineInfo = lineInfo;
        return tracker;
    }